

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.c
# Opt level: O0

int array_grow(void **src,size_t num_items,size_t *allocation_len,size_t item_size)

{
  void *pvVar1;
  size_t local_48;
  void *p;
  size_t n;
  size_t item_size_local;
  size_t *allocation_len_local;
  size_t num_items_local;
  void **src_local;
  
  if (num_items == *allocation_len) {
    if (*allocation_len == 0) {
      local_48 = 1;
    }
    else {
      local_48 = *allocation_len;
    }
    pvVar1 = realloc_array(*src,*allocation_len,local_48 << 1,item_size);
    if (pvVar1 == (void *)0x0) {
      return -3;
    }
    clear_and_free(*src,num_items * item_size);
    *src = pvVar1;
    *allocation_len = local_48 << 1;
  }
  return 0;
}

Assistant:

static int array_grow(void **src, size_t num_items, size_t *allocation_len,
                      size_t item_size)
{
    if (num_items == *allocation_len) {
        /* Array is full, allocate more space */
        const size_t n = (*allocation_len == 0 ? 1 : *allocation_len) * 2;
        void *p = realloc_array(*src, *allocation_len, n, item_size);
        if (!p)
            return WALLY_ENOMEM;
        /* Free and replace the old array with the new enlarged copy */
        clear_and_free(*src, num_items * item_size);
        *src = p;
        *allocation_len = n;
    }
    return WALLY_OK;
}